

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptnum_tests.cpp
# Opt level: O0

int scriptnum_tests::verify(EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  long in_FS_OFFSET;
  CScriptNum *in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  bool local_56;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CScriptNum10::getvch((CScriptNum10 *)in_stack_ffffffffffffff90);
  CScriptNum::getvch(in_stack_ffffffffffffff90);
  bVar2 = std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)sig,
                          in_stack_ffffffffffffffb0);
  local_56 = false;
  if (bVar2) {
    iVar3 = CScriptNum10::getint
                      ((CScriptNum10 *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                      );
    iVar4 = CScriptNum::getint((CScriptNum *)CONCAT44(iVar3,in_stack_ffffffffffffffa0));
    local_56 = iVar3 == iVar4;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(local_56,in_stack_ffffffffffffff98));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(local_56,in_stack_ffffffffffffff98));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (uint)CONCAT71((int7)((ulong)*(long *)(in_FS_OFFSET + 0x28) >> 8),local_56) & 0xffffff01;
}

Assistant:

static bool verify(const CScriptNum10& bignum, const CScriptNum& scriptnum)
{
    return bignum.getvch() == scriptnum.getvch() && bignum.getint() == scriptnum.getint();
}